

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive_vtable_conflict * archive_write_vtable(void)

{
  if (archive_write_vtable::inited == 0) {
    archive_write_vtable::av.archive_close = _archive_write_close;
    archive_write_vtable::av.archive_filter_bytes = _archive_filter_bytes;
    archive_write_vtable::av.archive_filter_code = _archive_filter_code;
    archive_write_vtable::av.archive_filter_name = _archive_filter_name;
    archive_write_vtable::av.archive_filter_count = _archive_write_filter_count;
    archive_write_vtable::av.archive_free = _archive_write_free;
    archive_write_vtable::av.archive_write_header = _archive_write_header;
    archive_write_vtable::av.archive_write_finish_entry = _archive_write_finish_entry;
    archive_write_vtable::av.archive_write_data = _archive_write_data;
    archive_write_vtable::inited = 1;
  }
  return &archive_write_vtable::av;
}

Assistant:

static struct archive_vtable *
archive_write_vtable(void)
{
	static struct archive_vtable av;
	static int inited = 0;

	if (!inited) {
		av.archive_close = _archive_write_close;
		av.archive_filter_bytes = _archive_filter_bytes;
		av.archive_filter_code = _archive_filter_code;
		av.archive_filter_name = _archive_filter_name;
		av.archive_filter_count = _archive_write_filter_count;
		av.archive_free = _archive_write_free;
		av.archive_write_header = _archive_write_header;
		av.archive_write_finish_entry = _archive_write_finish_entry;
		av.archive_write_data = _archive_write_data;
		inited = 1;
	}
	return (&av);
}